

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTShapeProfileDef::~IfcTShapeProfileDef(IfcTShapeProfileDef *this)

{
  _func_int *p_Var1;
  code *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = p_Var3 + 0x10 +
           (long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr.
                  _M_dataplus;
  *(long *)(pcVar2 + -0x40) = 0x871fc0;
  *(long *)(pcVar2 + 0xc0) = 0x871fe8;
  if (*(code **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(code **)(pcVar2 + -0x10),*(long *)pcVar2 + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0x118);
  return;
}

Assistant:

IfcTShapeProfileDef() : Object("IfcTShapeProfileDef") {}